

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  char cVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  DataKey *pDVar5;
  undefined1 auVar6 [16];
  DuplicateRowsPS *pDVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 uVar14;
  bool bVar15;
  Result RVar16;
  Verbosity VVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  pointer pDVar21;
  Item *pIVar22;
  SPxOut *pSVar23;
  int i;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long *plVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  pointer pnVar29;
  int iVar30;
  long lVar31;
  int *piVar32;
  cpp_dec_float<200u,int,void> *pcVar33;
  Verbosity *pVVar34;
  cpp_dec_float<200U,_int,_void> *pcVar35;
  pointer pnVar36;
  int **ppiVar37;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar38;
  undefined4 *puVar39;
  uint *puVar40;
  ulong uVar41;
  cpp_dec_float<200U,_int,_void> *pcVar42;
  uint *puVar43;
  soplex *psVar44;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar45;
  undefined4 *puVar46;
  uint uVar47;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar48;
  int iVar49;
  long lVar50;
  long in_FS_OFFSET;
  bool bVar51;
  byte bVar52;
  Real RVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  Verbosity old_verbosity;
  undefined1 auStack_cf4 [12];
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [16];
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [16];
  undefined1 local_ca8 [16];
  uint local_c98 [3];
  undefined3 uStack_c8b;
  int iStack_c88;
  bool bStack_c84;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c80;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c78;
  undefined8 uStack_c70;
  int *perm_tmp;
  undefined8 local_c58;
  undefined8 uStack_c50;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c48;
  undefined8 uStack_c40;
  Item *local_c30;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c28;
  undefined8 uStack_c20;
  DuplicateRowsPS *local_c10;
  ulong local_c08;
  long local_c00;
  long local_bf8;
  int *idxMem;
  int *local_be8;
  undefined8 uStack_be0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_bd8;
  undefined8 uStack_bd0;
  DataArray<int> local_bc0;
  uint local_ba8;
  uint local_ba4;
  bool *local_ba0;
  Real local_b98;
  Item *local_b90;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  Item *local_ae0;
  DataArray<bool> local_ad8;
  DataArray<bool> local_ac0;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  undefined1 local_a88 [120];
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a10;
  int local_a00;
  int local_9fc;
  int *local_9f8;
  undefined8 local_9f0;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_9e8;
  ulong local_9e0;
  int *perm;
  uint auStack_9d0 [25];
  undefined3 uStack_96b;
  int iStack_968;
  bool bStack_964;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_960;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_950;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_938;
  shared_ptr<soplex::Tolerances> local_920;
  shared_ptr<soplex::Tolerances> local_910;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  int *local_8c8;
  undefined8 local_8c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  DataArray<int> local_800;
  DataArray<int> local_7e8;
  int local_7d0;
  int local_7cc;
  bool *local_7c8;
  undefined8 local_7c0;
  undefined1 local_7b8 [128];
  undefined1 local_738 [128];
  cpp_dec_float<200U,_int,_void> local_6b8;
  undefined1 local_638 [128];
  cpp_dec_float<200u,int,void> local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [13];
  undefined3 uStack_54b;
  int iStack_548;
  char cStack_544;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_540;
  cpp_dec_float<200u,int,void> local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [13];
  undefined3 uStack_4cb;
  int iStack_4c8;
  undefined1 uStack_4c4;
  undefined8 local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  uint local_3b0 [28];
  undefined4 local_340 [28];
  uint local_2d0 [28];
  undefined4 local_260 [28];
  uint local_1f0 [28];
  undefined4 local_180 [28];
  uint local_110 [28];
  undefined4 local_a0 [28];
  
  bVar52 = 0;
  iVar20 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  RVar16 = removeEmpty(this,lp);
  if (RVar16 == OKAY) {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_cf4;
    _old_verbosity = auVar6 << 0x20;
    local_a00 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
    if (local_a00 < 1) {
      RVar16 = OKAY;
    }
    else {
      iVar30 = 0;
      VVar17 = ERROR;
      do {
        pIVar22 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem;
        iVar18 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[(int)VVar17].idx;
        if (pIVar22[iVar18].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused == 1) {
          removeRowSingleton(this,lp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)(pIVar22 + iVar18),(int *)&old_verbosity);
          iVar30 = iVar30 + 1;
          local_a00 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
          VVar17 = old_verbosity;
        }
        VVar17 = VVar17 + WARNING;
        old_verbosity = VVar17;
      } while ((int)VVar17 < local_a00);
      if (((0 < iVar30) &&
          (pSVar23 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout, pSVar23 != (SPxOut *)0x0)) && (3 < (int)pSVar23->m_verbosity)) {
        old_verbosity = pSVar23->m_verbosity;
        result_2.m_backend.data._M_elems[0] = 4;
        (*pSVar23->_vptr_SPxOut[2])();
        pSVar23 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar23->m_streams[pSVar23->m_verbosity],
                   "Simplifier duplicate rows (row singleton stage) removed ",0x38);
        std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar23->m_streams[pSVar23->m_verbosity]," rows, ",7);
        std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar23->m_streams[pSVar23->m_verbosity]," non-zeros",10);
        cVar1 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        pSVar23 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        (*pSVar23->_vptr_SPxOut[2])(pSVar23,&old_verbosity);
        local_a00 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
      }
      RVar16 = OKAY;
      if (1 < local_a00) {
        local_9f8 = (int *)0x0;
        local_9f0 = 0x3ff3333333333333;
        local_9fc = local_a00;
        spx_alloc<int*>(&local_9f8,local_a00);
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        local_8c8 = (int *)0x0;
        local_8c0 = 0x3ff3333333333333;
        iVar18 = 0;
        if (0 < iVar30) {
          iVar18 = iVar30;
        }
        iVar49 = 1;
        if (0 < iVar30) {
          iVar49 = iVar18;
        }
        spx_alloc<int*>(&local_8c8,iVar49);
        Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Array(&scale,(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
        idxMem = (int *)0x0;
        spx_alloc<int*>(&idxMem,(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum);
        local_be8 = idxMem;
        *local_9f8 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   scale.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,0.0);
        uVar47 = local_c58._4_4_;
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        *local_8c8 = iVar30;
        local_c58 = (double)((ulong)local_c58._4_4_ << 0x20);
        if (1 < iVar30) {
          lVar31 = 1;
          local_c58 = (double)((ulong)uVar47 << 0x20);
          lVar50 = 0x80;
          do {
            local_9f8[lVar31] = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)
                       ((long)((scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar50),0.0);
            local_8c8[lVar31] = 0;
            local_be8[lVar31 + -1] = (int)lVar31;
            lVar31 = lVar31 + 1;
            local_c58 = (double)CONCAT44(local_c58._4_4_,(int)local_c58 + 1);
            lVar50 = lVar50 + 0x80;
          } while (lVar31 < (lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        local_4c0._0_4_ = cpp_dec_float_finite;
        local_4c0._4_4_ = 0x1c;
        local_538[0] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[1] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[2] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[3] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[4] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[5] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[6] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[7] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[8] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[9] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[10] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[0xb] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[0xc] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[0xd] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[0xe] = (cpp_dec_float<200u,int,void>)0x0;
        local_538[0xf] = (cpp_dec_float<200u,int,void>)0x0;
        local_528 = (undefined1  [16])0x0;
        local_518 = (undefined1  [16])0x0;
        local_508 = (undefined1  [16])0x0;
        local_4f8 = (undefined1  [16])0x0;
        local_4e8 = (undefined1  [16])0x0;
        local_4d8 = SUB1613((undefined1  [16])0x0,0);
        uStack_4cb = 0;
        iStack_4c8 = 0;
        uStack_4c4 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_538,0.0);
        if (0 < (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar31 = 0;
          do {
            pIVar22 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem;
            iVar30 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar31].idx;
            local_c00 = lVar31;
            if (0 < pIVar22[iVar30].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
              local_c30 = pIVar22 + iVar30;
              lVar31 = 0;
              pDVar48 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x0;
              do {
                pNVar2 = (local_c30->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                puVar40 = (uint *)((long)(pNVar2->val).m_backend.data._M_elems + lVar31);
                pnVar38 = &result_2;
                for (lVar50 = 0x1c;
                    pnVar29 = scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start, lVar50 != 0;
                    lVar50 = lVar50 + -1) {
                  (pnVar38->m_backend).data._M_elems[0] = *puVar40;
                  puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                  pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                }
                result_2.m_backend.exp =
                     *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar31);
                result_2.m_backend.neg =
                     *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar31 + 4);
                result_2.m_backend._120_8_ =
                     *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar31 + 8);
                iVar30 = *(int *)((long)(&((local_c30->data).
                                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .m_elem)->val + 1) + lVar31);
                local_c48 = pDVar48;
                if (scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.fpclass !=
                    cpp_dec_float_NaN) {
                  local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1c00000000;
                  _old_verbosity = (undefined1  [16])0x0;
                  local_ce8 = (undefined1  [16])0x0;
                  local_cd8 = (undefined1  [16])0x0;
                  local_cc8 = (undefined1  [16])0x0;
                  local_cb8 = (undefined1  [16])0x0;
                  local_ca8 = (undefined1  [16])0x0;
                  local_c98[0] = 0;
                  local_c98[1] = 0;
                  stack0xfffffffffffff370 = 0;
                  uStack_c8b = 0;
                  iStack_c88 = 0;
                  bStack_c84 = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
                  iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&pnVar29[iVar30].m_backend,
                                      (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                  if (iVar18 == 0) {
                    pnVar38 = &result_2;
                    pnVar29 = scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar30;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      (pnVar29->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
                      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                      pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar52 * -2 + 1) * 4);
                    }
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.exp =
                         result_2.m_backend.exp;
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.neg =
                         result_2.m_backend.neg;
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.fpclass =
                         result_2.m_backend.fpclass;
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.prec_elem =
                         result_2.m_backend.prec_elem;
                  }
                }
                iVar18 = local_9f8[iVar30];
                pDVar21 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x1c00000000;
                _old_verbosity = (undefined1  [16])0x0;
                local_ce8 = (undefined1  [16])0x0;
                local_cd8 = (undefined1  [16])0x0;
                local_cc8 = (undefined1  [16])0x0;
                local_cb8 = (undefined1  [16])0x0;
                local_ca8 = (undefined1  [16])0x0;
                local_c98[0] = 0;
                local_c98[1] = 0;
                stack0xfffffffffffff370 = 0;
                uStack_c8b = 0;
                iStack_c88 = 0;
                bStack_c84 = false;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&result_2.m_backend,
                           &scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend);
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add(pDVar21 + iVar18,iVar30,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&old_verbosity);
                piVar32 = local_8c8 + local_9f8[iVar30];
                *piVar32 = *piVar32 + -1;
                if (*piVar32 == 0) {
                  lVar50 = (long)(int)local_c58;
                  local_c58 = (double)CONCAT44(local_c58._4_4_,(int)local_c58 + 1);
                  local_be8[lVar50] = local_9f8[iVar30];
                }
                pDVar48 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)&local_c48->_vptr_DSVectorBase + 1);
                iVar30 = (local_c30->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
                uVar24 = (ulong)iVar30;
                lVar31 = lVar31 + 0x84;
              } while ((long)pDVar48 < (long)uVar24);
              if (0 < iVar30) {
                pDVar21 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar31 = 0;
                pIVar22 = local_c30;
                do {
                  pDVar48 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)local_9f8[(pIVar22->data).
                                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                .m_elem[lVar31].idx] * 0x20);
                  if (0 < *(int *)((long)&(pDVar48->
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).memused + (long)pDVar21)) {
                    pTVar3 = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    p_Var4 = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                      }
                    }
                    RVar53 = Tolerances::epsilon(pTVar3);
                    local_540 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    local_5b8[0] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[1] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[2] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[3] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[4] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[5] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[6] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[7] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[8] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[9] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[10] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[0xb] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[0xc] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[0xd] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[0xe] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5b8[0xf] = (cpp_dec_float<200u,int,void>)0x0;
                    local_5a8 = (undefined1  [16])0x0;
                    local_598 = (undefined1  [16])0x0;
                    local_588 = (undefined1  [16])0x0;
                    local_578 = (undefined1  [16])0x0;
                    local_568 = (undefined1  [16])0x0;
                    local_558 = SUB1613((undefined1  [16])0x0,0);
                    uStack_54b = 0;
                    iStack_548 = 0;
                    cStack_544 = '\0';
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              (local_5b8,RVar53);
                    pcVar33 = local_5b8;
                    puVar39 = (undefined4 *)local_a88;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      *puVar39 = *(undefined4 *)pcVar33;
                      pcVar33 = pcVar33 + (ulong)bVar52 * -8 + 4;
                      puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                    }
                    local_a88._112_4_ = iStack_548;
                    local_a88[0x74] = cStack_544;
                    local_a10 = local_540;
                    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                    }
                    pDVar21 = (this->m_classSetRows).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    iVar30 = *(int *)((long)&(pDVar48->
                                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).memused + (long)pDVar21);
                    if (1 < iVar30) {
                      SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                                (*(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   **)((long)&(pDVar48->
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).m_elem + (long)pDVar21),iVar30,
                                 (ElementCompare *)local_a88,0,true);
                      pDVar21 = (this->m_classSetRows).data.
                                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    local_bf8 = lVar31;
                    local_bd8 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(local_bd8._4_4_,*local_be8);
                    lVar31 = (long)(int)local_c58;
                    local_c58 = (double)CONCAT44(local_c58._4_4_,(int)local_c58 + -1);
                    *local_be8 = local_be8[lVar31 + -1];
                    if (0 < *(int *)((long)&(pDVar48->
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).memused + (long)pDVar21)) {
                      plVar27 = (long *)((long)&(pDVar48->
                                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).m_elem + (long)pDVar21);
                      lVar31 = 0;
                      lVar50 = 0;
                      local_c78 = pDVar48;
                      do {
                        uVar14 = uStack_4c4;
                        iVar30 = iStack_4c8;
                        if (lVar31 != 0) {
                          lVar26 = *plVar27;
                          puVar39 = (undefined4 *)(lVar26 + lVar31);
                          puVar46 = local_a0;
                          for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                            *puVar46 = *puVar39;
                            puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                            puVar46 = puVar46 + (ulong)bVar52 * -2 + 1;
                          }
                          iVar18 = *(int *)(lVar26 + 0x70 + lVar31);
                          cVar1 = *(char *)(lVar26 + 0x74 + lVar31);
                          local_c48 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        **)(lVar26 + 0x78 + lVar31);
                          uStack_c40 = 0;
                          pcVar33 = local_538;
                          puVar40 = local_110;
                          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                            *puVar40 = *(uint *)pcVar33;
                            pcVar33 = pcVar33 + ((ulong)bVar52 * -2 + 1) * 4;
                            puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                          }
                          local_c28 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)local_4c0;
                          uStack_c20 = 0;
                          epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_430,this);
                          puVar39 = local_a0;
                          psVar44 = (soplex *)&perm;
                          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                            *(undefined4 *)psVar44 = *puVar39;
                            puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                            psVar44 = psVar44 + (ulong)bVar52 * -8 + 4;
                          }
                          iStack_968 = iVar18;
                          bStack_964 = (bool)cVar1;
                          local_960 = local_c48;
                          puVar40 = local_110;
                          pnVar38 = &factor;
                          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                            (pnVar38->m_backend).data._M_elems[0] = *puVar40;
                            puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                          }
                          factor.m_backend.exp = iVar30;
                          factor.m_backend.neg = (bool)uVar14;
                          factor.m_backend._120_8_ = local_c28;
                          relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                    (&result_2,(soplex *)&perm,&factor,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x0);
                          pnVar38 = &result_2;
                          pcVar28 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                            (pcVar28->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
                            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                            pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar28 + (ulong)bVar52 * -8 + 4);
                          }
                          iStack_c88 = result_2.m_backend.exp;
                          bStack_c84 = result_2.m_backend.neg;
                          local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)result_2.m_backend._120_8_;
                          if ((result_2.m_backend.neg == true) &&
                             (old_verbosity != ERROR ||
                              result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                            bStack_c84 = false;
                          }
                          pDVar48 = local_c78;
                          if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                              (local_430.fpclass != cpp_dec_float_NaN)) &&
                             (iVar30 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                                  &local_430), pDVar48 = local_c78, 0 < iVar30)) {
                            local_bd8 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(local_bd8._4_4_,*local_be8);
                            lVar26 = (long)(int)local_c58;
                            local_c58 = (double)CONCAT44(local_c58._4_4_,(int)local_c58 + -1);
                            *local_be8 = local_be8[lVar26 + -1];
                          }
                        }
                        pDVar21 = (this->m_classSetRows).data.
                                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        plVar27 = (long *)((long)&(pDVar48->
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).m_elem + (long)pDVar21);
                        lVar26 = *plVar27;
                        local_9f8[*(int *)(lVar26 + 0x80 + lVar31)] = (int)local_bd8;
                        local_8c8[(int)local_bd8] = local_8c8[(int)local_bd8] + 1;
                        puVar39 = (undefined4 *)(lVar26 + lVar31);
                        pcVar33 = local_538;
                        for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                          *(undefined4 *)pcVar33 = *puVar39;
                          puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                          pcVar33 = pcVar33 + ((ulong)bVar52 * -2 + 1) * 4;
                        }
                        iStack_4c8 = *(int *)(lVar26 + 0x70 + lVar31);
                        uStack_4c4 = *(undefined1 *)(lVar26 + 0x74 + lVar31);
                        local_4c0 = *(undefined8 *)(lVar26 + 0x78 + lVar31);
                        lVar50 = lVar50 + 1;
                        lVar31 = lVar31 + 0x84;
                      } while (lVar50 < *(int *)((long)&(pDVar48->
                                                                                                                
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).memused + (long)pDVar21));
                    }
                    *(undefined4 *)
                     ((long)&(pDVar48->
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).memused + (long)pDVar21) = 0;
                    uVar24 = (ulong)(uint)(local_c30->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .memused;
                    pIVar22 = local_c30;
                    lVar31 = local_bf8;
                  }
                  lVar31 = lVar31 + 1;
                } while (lVar31 < (int)uVar24);
              }
            }
            lVar31 = local_c00 + 1;
          } while (lVar31 < (lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        free(idxMem);
        idxMem = (int *)0x0;
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        local_7c8 = (bool *)0x0;
        local_7c0 = 0x3ff3333333333333;
        local_7d0 = 0;
        if (0 < iVar30) {
          local_7d0 = iVar30;
        }
        local_7cc = 1;
        if (0 < iVar30) {
          local_7cc = local_7d0;
        }
        spx_alloc<bool*>(&local_7c8,local_7cc);
        auVar6 = _DAT_005f4040;
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        uVar24 = (ulong)iVar30;
        if (0 < (long)uVar24) {
          pDVar21 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar31 = uVar24 - 1;
          auVar54._8_4_ = (int)lVar31;
          auVar54._0_8_ = lVar31;
          auVar54._12_4_ = (int)((ulong)lVar31 >> 0x20);
          lVar31 = 0;
          auVar54 = auVar54 ^ _DAT_005f4040;
          auVar55 = _DAT_005f4020;
          auVar56 = _DAT_005f4030;
          do {
            auVar57 = auVar56 ^ auVar6;
            iVar18 = auVar54._4_4_;
            if ((bool)(~(auVar57._4_4_ == iVar18 && auVar54._0_4_ < auVar57._0_4_ ||
                        iVar18 < auVar57._4_4_) & 1)) {
              *(undefined4 *)
               ((long)&(pDVar21->
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).memused + lVar31) = 0;
            }
            if ((auVar57._12_4_ != auVar54._12_4_ || auVar57._8_4_ <= auVar54._8_4_) &&
                auVar57._12_4_ <= auVar54._12_4_) {
              *(undefined4 *)
               ((long)&pDVar21[1].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused + lVar31) = 0;
            }
            auVar57 = auVar55 ^ auVar6;
            iVar49 = auVar57._4_4_;
            if (iVar49 <= iVar18 && (iVar49 != iVar18 || auVar57._0_4_ <= auVar54._0_4_)) {
              *(undefined4 *)
               ((long)&pDVar21[2].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused + lVar31) = 0;
              *(undefined4 *)
               ((long)&pDVar21[3].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused + lVar31) = 0;
            }
            lVar50 = auVar56._8_8_;
            auVar56._0_8_ = auVar56._0_8_ + 4;
            auVar56._8_8_ = lVar50 + 4;
            lVar50 = auVar55._8_8_;
            auVar55._0_8_ = auVar55._0_8_ + 4;
            auVar55._8_8_ = lVar50 + 4;
            lVar31 = lVar31 + 0x80;
          } while ((ulong)(iVar30 + 3U >> 2) << 7 != lVar31);
          if (0 < iVar30) {
            lVar31 = 0;
            do {
              local_7c8[lVar31] = false;
              iVar30 = local_9f8[lVar31];
              pDVar21 = (this->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              _old_verbosity = (undefined1  [16])0x0;
              local_ce8 = (undefined1  [16])0x0;
              local_cd8 = (undefined1  [16])0x0;
              local_cc8 = (undefined1  [16])0x0;
              local_cb8 = (undefined1  [16])0x0;
              local_ca8 = (undefined1  [16])0x0;
              local_c98[0] = 0;
              local_c98[1] = 0;
              stack0xfffffffffffff370 = 0;
              uStack_c8b = 0;
              iStack_c88 = 0;
              bStack_c84 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar21 + iVar30,(int)lVar31,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&old_verbosity);
              lVar31 = lVar31 + 1;
              uVar24 = (ulong)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
            } while (lVar31 < (long)uVar24);
          }
        }
        perm_tmp = (int *)0x0;
        iVar30 = (int)uVar24;
        spx_alloc<int*>(&perm_tmp,iVar30);
        local_c08 = uVar24 & 0xffffffff;
        if (0 < iVar30) {
          memset(perm_tmp,0,local_c08 * 4);
        }
        iVar18 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        if (iVar18 < 1) {
          local_b90 = (Item *)0xffffffff;
          local_ae0 = (Item *)0xffffffff;
        }
        else {
          pDVar21 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar22 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem;
          pDVar5 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey;
          local_b90 = (Item *)0xffffffff;
          uVar41 = 0;
          uVar47 = 0xffffffff;
          do {
            if ((1 < pDVar21[uVar41].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused) &&
               (pNVar2 = pDVar21[uVar41].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem,
               pIVar22[pDVar5[pNVar2->idx].idx].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused != 1)) {
              if ((int)uVar47 < 0) {
                uVar47 = (uint)uVar41;
              }
              piVar32 = &pNVar2[1].idx;
              lVar31 = 1;
              do {
                perm_tmp[*piVar32] = -1;
                lVar31 = lVar31 + 1;
                piVar32 = piVar32 + 0x21;
              } while (lVar31 < pDVar21[uVar41].
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused);
              iVar18 = (lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
              local_b90 = (Item *)(uVar41 & 0xffffffff);
            }
            uVar41 = uVar41 + 1;
          } while ((long)uVar41 < (long)iVar18);
          local_ae0 = (Item *)(ulong)uVar47;
        }
        if (0 < iVar30) {
          uVar41 = 0;
          iVar18 = 0;
          do {
            if (-1 < perm_tmp[uVar41]) {
              perm_tmp[uVar41] = iVar18;
              iVar18 = iVar18 + 1;
            }
            uVar41 = uVar41 + 1;
          } while (local_c08 != uVar41);
        }
        local_c48 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&(lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left;
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::vector(&newLhsVec.val,
                 (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)local_c48);
        local_c28 = &(lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right;
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::vector(&newRhsVec.val,&local_c28->val);
        uVar47 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        uVar41 = (ulong)uVar47;
        if (0 < (int)uVar47) {
          local_be8 = *(int **)(in_FS_OFFSET + -8);
          uStack_be0 = 0;
          local_c58 = -(double)local_be8;
          uStack_c50 = 0x8000000000000000;
          local_9e8 = &this->m_hist;
          iVar18 = iVar30;
          if (iVar30 < 1) {
            iVar30 = 1;
            iVar18 = 0;
          }
          pIVar22 = (Item *)0x0;
          bVar15 = false;
          local_9e0 = uVar24;
          do {
            pDVar21 = (this->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pDVar48 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pIVar22 * 0x20);
            iVar49 = *(int *)((long)&(pDVar48->
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).memused + (long)pDVar21);
            local_c30 = pIVar22;
            if ((1 < iVar49) &&
               ((lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem
                [(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey
                 [*(int *)(*(long *)((long)&(pDVar48->
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).m_elem + (long)pDVar21) + 0x80)].idx].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused != 1)) {
              piVar32 = (this->m_stat).data;
              piVar32[0xc] = iVar49 + piVar32[0xc] + -1;
              ::soplex::infinity::__tls_init();
              local_6b8.fpclass = cpp_dec_float_finite;
              local_6b8.prec_elem = 0x1c;
              local_6b8.data._M_elems[0] = 0;
              local_6b8.data._M_elems[1] = 0;
              local_6b8.data._M_elems[2] = 0;
              local_6b8.data._M_elems[3] = 0;
              local_6b8.data._M_elems[4] = 0;
              local_6b8.data._M_elems[5] = 0;
              local_6b8.data._M_elems[6] = 0;
              local_6b8.data._M_elems[7] = 0;
              local_6b8.data._M_elems[8] = 0;
              local_6b8.data._M_elems[9] = 0;
              local_6b8.data._M_elems[10] = 0;
              local_6b8.data._M_elems[0xb] = 0;
              local_6b8.data._M_elems[0xc] = 0;
              local_6b8.data._M_elems[0xd] = 0;
              local_6b8.data._M_elems[0xe] = 0;
              local_6b8.data._M_elems[0xf] = 0;
              local_6b8.data._M_elems[0x10] = 0;
              local_6b8.data._M_elems[0x11] = 0;
              local_6b8.data._M_elems[0x12] = 0;
              local_6b8.data._M_elems[0x13] = 0;
              local_6b8.data._M_elems[0x14] = 0;
              local_6b8.data._M_elems[0x15] = 0;
              local_6b8.data._M_elems[0x16] = 0;
              local_6b8.data._M_elems[0x17] = 0;
              local_6b8.data._M_elems[0x18] = 0;
              local_6b8.data._M_elems[0x19] = 0;
              local_6b8.data._M_elems._104_5_ = 0;
              local_6b8.data._M_elems[0x1b]._1_3_ = 0;
              local_6b8.exp = 0;
              local_6b8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_6b8,local_c58);
              ::soplex::infinity::__tls_init();
              local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x1c00000000;
              _old_verbosity = ZEXT816(0);
              local_ce8 = ZEXT816(0);
              local_cd8 = ZEXT816(0);
              local_cc8 = ZEXT816(0);
              local_cb8 = ZEXT816(0);
              local_ca8 = ZEXT816(0);
              local_c98[0] = 0;
              local_c98[1] = 0;
              stack0xfffffffffffff370 = 0;
              uStack_c8b = 0;
              iStack_c88 = 0;
              bStack_c84 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&old_verbosity,(double)local_be8);
              pcVar33 = (cpp_dec_float<200u,int,void> *)&old_verbosity;
              puVar39 = (undefined4 *)local_638;
              for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                *puVar39 = *(undefined4 *)pcVar33;
                pcVar33 = pcVar33 + (ulong)bVar52 * -8 + 4;
                puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
              }
              local_638._112_4_ = iStack_c88;
              local_638[0x74] = bStack_c84;
              local_638._120_8_ = local_c80;
              local_ba4 = *(uint *)((long)&(pDVar48->
                                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).memused +
                                   (long)(this->m_dupRows).data.
                                         super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              local_ba0 = (bool *)0x0;
              local_b98 = 1.2;
              local_ba8 = local_ba4;
              if ((int)local_ba4 < 1) {
                local_ba8 = 0;
                local_ba4 = 1;
              }
              spx_alloc<bool*>(&local_ba0,local_ba4);
              pDVar21 = (this->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar51 = true;
              if (0 < *(int *)((long)&(pDVar48->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).memused + (long)pDVar21)) {
                lVar31 = (long)&pDVar48->_vptr_DSVectorBase + (long)pDVar21;
                local_c00 = CONCAT44(local_c00._4_4_,0xffffffff);
                lVar26 = 0x80;
                lVar50 = 0;
                local_bf8 = CONCAT44(local_bf8._4_4_,0xffffffff);
                local_bd8 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(local_bd8._4_4_,0xffffffff);
                local_c78 = pDVar48;
                do {
                  iVar49 = *(int *)(*(long *)(lVar31 + 8) + lVar26);
                  pnVar29 = (((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)&local_c48->_vptr_DSVectorBase)->
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  bVar51 = false;
                  if ((pnVar29[iVar49].m_backend.fpclass != cpp_dec_float_NaN) &&
                     (pnVar36 = (local_c28->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start, bVar51 = false,
                     pnVar36[iVar49].m_backend.fpclass != cpp_dec_float_NaN)) {
                    iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&pnVar29[iVar49].m_backend,&pnVar36[iVar49].m_backend);
                    bVar51 = iVar19 == 0;
                  }
                  local_ba0[lVar50] = bVar51;
                  if ((int)local_bd8 == -1) {
                    pnVar29 = (((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)&local_c48->_vptr_DSVectorBase)->
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    pnVar36 = pnVar29 + iVar49;
                    pcVar28 = &local_6b8;
                    for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                      (pcVar28->data)._M_elems[0] = (pnVar36->m_backend).data._M_elems[0];
                      pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar52 * -2 + 1) * 4);
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar52 * -8 + 4);
                    }
                    local_6b8.exp = pnVar29[iVar49].m_backend.exp;
                    local_6b8.neg = pnVar29[iVar49].m_backend.neg;
                    local_6b8.fpclass = pnVar29[iVar49].m_backend.fpclass;
                    local_6b8.prec_elem = pnVar29[iVar49].m_backend.prec_elem;
                    pnVar29 = (local_c28->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pnVar36 = pnVar29 + iVar49;
                    puVar39 = (undefined4 *)local_638;
                    for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                      *puVar39 = (pnVar36->m_backend).data._M_elems[0];
                      pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar52 * -2 + 1) * 4);
                      puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                    }
                    local_638._112_4_ = pnVar29[iVar49].m_backend.exp;
                    local_638[0x74] = pnVar29[iVar49].m_backend.neg;
                    local_638._120_4_ = pnVar29[iVar49].m_backend.fpclass;
                    local_638._124_4_ = pnVar29[iVar49].m_backend.prec_elem;
                    local_bd8 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(local_bd8._4_4_,iVar49);
                  }
                  else {
                    result_2.m_backend.fpclass = cpp_dec_float_finite;
                    result_2.m_backend.prec_elem = 0x1c;
                    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                    result_2.m_backend.data._M_elems[0x18] = 0;
                    result_2.m_backend.data._M_elems[0x19] = 0;
                    result_2.m_backend.data._M_elems._104_5_ = 0;
                    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                    result_2.m_backend.exp = 0;
                    result_2.m_backend.neg = false;
                    local_960 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x1c00000000;
                    perm = (int *)0x0;
                    auStack_9d0[0] = 0;
                    auStack_9d0[1] = 0;
                    auStack_9d0[2] = 0;
                    auStack_9d0[3] = 0;
                    auStack_9d0[4] = 0;
                    auStack_9d0[5] = 0;
                    auStack_9d0[6] = 0;
                    auStack_9d0[7] = 0;
                    auStack_9d0[8] = 0;
                    auStack_9d0[9] = 0;
                    auStack_9d0[10] = 0;
                    auStack_9d0[0xb] = 0;
                    auStack_9d0[0xc] = 0;
                    auStack_9d0[0xd] = 0;
                    auStack_9d0[0xe] = 0;
                    auStack_9d0[0xf] = 0;
                    auStack_9d0[0x10] = 0;
                    auStack_9d0[0x11] = 0;
                    auStack_9d0[0x12] = 0;
                    auStack_9d0[0x13] = 0;
                    auStack_9d0[0x14] = 0;
                    auStack_9d0[0x15] = 0;
                    auStack_9d0[0x16] = 0;
                    auStack_9d0[0x17] = 0;
                    stack0xfffffffffffff690 = 0;
                    uStack_96b = 0;
                    iStack_968 = 0;
                    bStack_964 = false;
                    factor.m_backend.fpclass = cpp_dec_float_finite;
                    factor.m_backend.prec_elem = 0x1c;
                    factor.m_backend.data._M_elems[0] = 0;
                    factor.m_backend.data._M_elems[1] = 0;
                    factor.m_backend.data._M_elems[2] = 0;
                    factor.m_backend.data._M_elems[3] = 0;
                    factor.m_backend.data._M_elems[4] = 0;
                    factor.m_backend.data._M_elems[5] = 0;
                    factor.m_backend.data._M_elems[6] = 0;
                    factor.m_backend.data._M_elems[7] = 0;
                    factor.m_backend.data._M_elems[8] = 0;
                    factor.m_backend.data._M_elems[9] = 0;
                    factor.m_backend.data._M_elems[10] = 0;
                    factor.m_backend.data._M_elems[0xb] = 0;
                    factor.m_backend.data._M_elems[0xc] = 0;
                    factor.m_backend.data._M_elems[0xd] = 0;
                    factor.m_backend.data._M_elems[0xe] = 0;
                    factor.m_backend.data._M_elems[0xf] = 0;
                    factor.m_backend.data._M_elems[0x10] = 0;
                    factor.m_backend.data._M_elems[0x11] = 0;
                    factor.m_backend.data._M_elems[0x12] = 0;
                    factor.m_backend.data._M_elems[0x13] = 0;
                    factor.m_backend.data._M_elems[0x14] = 0;
                    factor.m_backend.data._M_elems[0x15] = 0;
                    factor.m_backend.data._M_elems[0x16] = 0;
                    factor.m_backend.data._M_elems[0x17] = 0;
                    factor.m_backend.data._M_elems[0x18] = 0;
                    factor.m_backend.data._M_elems[0x19] = 0;
                    factor.m_backend.data._M_elems._104_5_ = 0;
                    factor.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                    factor.m_backend.exp = 0;
                    factor.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              (&factor.m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)local_bd8].m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend);
                    if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0055bfb9:
                      pcVar28 = &(local_c28->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                      ::soplex::infinity::__tls_init();
                      local_a10 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0x1c00000000;
                      local_a88._0_4_ = 0;
                      local_a88._4_4_ = 0;
                      local_a88._8_4_ = 0;
                      local_a88._12_4_ = 0;
                      local_a88._16_4_ = 0;
                      local_a88._20_4_ = 0;
                      local_a88._24_4_ = 0;
                      local_a88._28_4_ = 0;
                      local_a88._32_4_ = 0;
                      local_a88._36_4_ = 0;
                      local_a88._40_4_ = 0;
                      local_a88._44_4_ = 0;
                      local_a88._48_4_ = 0;
                      local_a88._52_4_ = 0;
                      local_a88._56_4_ = 0;
                      local_a88._60_4_ = 0;
                      local_a88._64_4_ = 0;
                      local_a88._68_4_ = 0;
                      local_a88._72_4_ = 0;
                      local_a88._76_4_ = 0;
                      local_a88._80_4_ = 0;
                      local_a88._84_4_ = 0;
                      local_a88._88_4_ = 0;
                      local_a88._92_4_ = 0;
                      local_a88._96_4_ = 0;
                      local_a88._100_4_ = 0;
                      local_a88._104_5_ = 0;
                      local_a88._109_3_ = 0;
                      local_a88._112_4_ = 0;
                      local_a88[0x74] = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_a88,(double)local_be8);
                      if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_a10 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare(pcVar28,(cpp_dec_float<200U,_int,_void> *)local_a88),
                         iVar19 < 0)) {
                        pcVar28 = &(local_c28->val).
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                          pcVar35 = pcVar28;
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                            (pcVar42->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar35 + (ulong)bVar52 * -8 + 4);
                            pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar42 + (ulong)bVar52 * -8 + 4);
                          }
                          iStack_c88 = pcVar28->exp;
                          bStack_c84 = pcVar28->neg;
                          local_c80._0_4_ = pcVar28->fpclass;
                          local_c80._4_4_ = pcVar28->prec_elem;
                        }
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                  ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                   &factor.m_backend);
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,local_c58);
                      }
                      pVVar34 = &old_verbosity;
                      pnVar38 = &result_2;
                      for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                        (pnVar38->m_backend).data._M_elems[0] = *pVVar34;
                        pVVar34 = pVVar34 + (ulong)bVar52 * -2 + 1;
                        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                      }
                      result_2.m_backend.exp = iStack_c88;
                      result_2.m_backend.neg = bStack_c84;
                      result_2.m_backend._120_8_ = local_c80;
                      pcVar28 = &(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)&local_c48->_vptr_DSVectorBase)->
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                      ::soplex::infinity::__tls_init();
                      local_a10 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0x1c00000000;
                      local_a88._0_4_ = 0;
                      local_a88._4_4_ = 0;
                      local_a88._8_4_ = 0;
                      local_a88._12_4_ = 0;
                      local_a88._16_4_ = 0;
                      local_a88._20_4_ = 0;
                      local_a88._24_4_ = 0;
                      local_a88._28_4_ = 0;
                      local_a88._32_4_ = 0;
                      local_a88._36_4_ = 0;
                      local_a88._40_4_ = 0;
                      local_a88._44_4_ = 0;
                      local_a88._48_4_ = 0;
                      local_a88._52_4_ = 0;
                      local_a88._56_4_ = 0;
                      local_a88._60_4_ = 0;
                      local_a88._64_4_ = 0;
                      local_a88._68_4_ = 0;
                      local_a88._72_4_ = 0;
                      local_a88._76_4_ = 0;
                      local_a88._80_4_ = 0;
                      local_a88._84_4_ = 0;
                      local_a88._88_4_ = 0;
                      local_a88._92_4_ = 0;
                      local_a88._96_4_ = 0;
                      local_a88._100_4_ = 0;
                      local_a88._104_5_ = 0;
                      local_a88._109_3_ = 0;
                      local_a88._112_4_ = 0;
                      local_a88[0x74] = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_a88,local_c58);
                      if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_a10 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare(pcVar28,(cpp_dec_float<200U,_int,_void> *)local_a88),
                         0 < iVar19)) {
                        pcVar28 = &(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)&local_c48->_vptr_DSVectorBase)->
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                          pcVar35 = pcVar28;
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                            (pcVar42->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar35 + (ulong)bVar52 * -8 + 4);
                            pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar42 + (ulong)bVar52 * -8 + 4);
                          }
                          iStack_c88 = pcVar28->exp;
                          bStack_c84 = pcVar28->neg;
                          local_c80 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        **)&pcVar28->fpclass;
                        }
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                  ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                   &factor.m_backend);
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,(double)local_be8)
                        ;
                      }
                    }
                    else {
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      cpp_dec_float<long_long>
                                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,0,(type *)0x0);
                      iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&factor.m_backend,
                                       (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                      if (iVar19 < 1) goto LAB_0055bfb9;
                      pcVar28 = &(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)&local_c48->_vptr_DSVectorBase)->
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                      ::soplex::infinity::__tls_init();
                      local_a10 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0x1c00000000;
                      local_a88._0_4_ = 0;
                      local_a88._4_4_ = 0;
                      local_a88._8_4_ = 0;
                      local_a88._12_4_ = 0;
                      local_a88._16_4_ = 0;
                      local_a88._20_4_ = 0;
                      local_a88._24_4_ = 0;
                      local_a88._28_4_ = 0;
                      local_a88._32_4_ = 0;
                      local_a88._36_4_ = 0;
                      local_a88._40_4_ = 0;
                      local_a88._44_4_ = 0;
                      local_a88._48_4_ = 0;
                      local_a88._52_4_ = 0;
                      local_a88._56_4_ = 0;
                      local_a88._60_4_ = 0;
                      local_a88._64_4_ = 0;
                      local_a88._68_4_ = 0;
                      local_a88._72_4_ = 0;
                      local_a88._76_4_ = 0;
                      local_a88._80_4_ = 0;
                      local_a88._84_4_ = 0;
                      local_a88._88_4_ = 0;
                      local_a88._92_4_ = 0;
                      local_a88._96_4_ = 0;
                      local_a88._100_4_ = 0;
                      local_a88._104_5_ = 0;
                      local_a88._109_3_ = 0;
                      local_a88._112_4_ = 0;
                      local_a88[0x74] = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_a88,local_c58);
                      if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_a10 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare(pcVar28,(cpp_dec_float<200U,_int,_void> *)local_a88),
                         0 < iVar19)) {
                        pcVar28 = &(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)&local_c48->_vptr_DSVectorBase)->
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                          pcVar35 = pcVar28;
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                            (pcVar42->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar35 + (ulong)bVar52 * -8 + 4);
                            pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar42 + (ulong)bVar52 * -8 + 4);
                          }
                          iStack_c88 = pcVar28->exp;
                          bStack_c84 = pcVar28->neg;
                          local_c80._0_4_ = pcVar28->fpclass;
                          local_c80._4_4_ = pcVar28->prec_elem;
                        }
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                  ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                   &factor.m_backend);
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,local_c58);
                      }
                      pVVar34 = &old_verbosity;
                      pnVar38 = &result_2;
                      for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                        (pnVar38->m_backend).data._M_elems[0] = *pVVar34;
                        pVVar34 = pVVar34 + (ulong)bVar52 * -2 + 1;
                        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                      }
                      result_2.m_backend.exp = iStack_c88;
                      result_2.m_backend.neg = bStack_c84;
                      result_2.m_backend._120_8_ = local_c80;
                      pcVar28 = &(local_c28->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                      ::soplex::infinity::__tls_init();
                      local_a10 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0x1c00000000;
                      local_a88._0_4_ = 0;
                      local_a88._4_4_ = 0;
                      local_a88._8_4_ = 0;
                      local_a88._12_4_ = 0;
                      local_a88._16_4_ = 0;
                      local_a88._20_4_ = 0;
                      local_a88._24_4_ = 0;
                      local_a88._28_4_ = 0;
                      local_a88._32_4_ = 0;
                      local_a88._36_4_ = 0;
                      local_a88._40_4_ = 0;
                      local_a88._44_4_ = 0;
                      local_a88._48_4_ = 0;
                      local_a88._52_4_ = 0;
                      local_a88._56_4_ = 0;
                      local_a88._60_4_ = 0;
                      local_a88._64_4_ = 0;
                      local_a88._68_4_ = 0;
                      local_a88._72_4_ = 0;
                      local_a88._76_4_ = 0;
                      local_a88._80_4_ = 0;
                      local_a88._84_4_ = 0;
                      local_a88._88_4_ = 0;
                      local_a88._92_4_ = 0;
                      local_a88._96_4_ = 0;
                      local_a88._100_4_ = 0;
                      local_a88._104_5_ = 0;
                      local_a88._109_3_ = 0;
                      local_a88._112_4_ = 0;
                      local_a88[0x74] = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)local_a88,(double)local_be8);
                      if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_a10 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare(pcVar28,(cpp_dec_float<200U,_int,_void> *)local_a88),
                         iVar19 < 0)) {
                        pcVar28 = &(local_c28->val).
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar49].m_backend;
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                          pcVar35 = pcVar28;
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                            (pcVar42->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar35 + (ulong)bVar52 * -8 + 4);
                            pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar42 + (ulong)bVar52 * -8 + 4);
                          }
                          iStack_c88 = pcVar28->exp;
                          bStack_c84 = pcVar28->neg;
                          local_c80 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        **)&pcVar28->fpclass;
                        }
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                  ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                   &factor.m_backend);
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1c00000000;
                        _old_verbosity = ZEXT816(0);
                        local_ce8 = ZEXT816(0);
                        local_cd8 = ZEXT816(0);
                        local_cc8 = ZEXT816(0);
                        local_cb8 = ZEXT816(0);
                        local_ca8 = ZEXT816(0);
                        local_c98[0] = 0;
                        local_c98[1] = 0;
                        stack0xfffffffffffff370 = 0;
                        uStack_c8b = 0;
                        iStack_c88 = 0;
                        bStack_c84 = false;
                        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,(double)local_be8)
                        ;
                      }
                    }
                    pVVar34 = &old_verbosity;
                    ppiVar37 = &perm;
                    for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                      *(Verbosity *)ppiVar37 = *pVVar34;
                      pVVar34 = pVVar34 + (ulong)bVar52 * -2 + 1;
                      ppiVar37 = (int **)((long)ppiVar37 + (ulong)bVar52 * -8 + 4);
                    }
                    iStack_968 = iStack_c88;
                    bStack_964 = bStack_c84;
                    local_960 = local_c80;
                    if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                        (local_6b8.fpclass != cpp_dec_float_NaN)) &&
                       (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(&result_2.m_backend,&local_6b8), 0 < iVar19)) {
                      pnVar38 = &result_2;
                      pcVar28 = &local_6b8;
                      for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                        (pcVar28->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
                        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                        pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar28 + ((ulong)bVar52 * -2 + 1) * 4);
                      }
                      local_6b8.exp = result_2.m_backend.exp;
                      local_6b8.neg = result_2.m_backend.neg;
                      local_6b8.fpclass = result_2.m_backend.fpclass;
                      local_6b8.prec_elem = result_2.m_backend.prec_elem;
                      local_bf8 = CONCAT44(local_bf8._4_4_,iVar49);
                    }
                    if ((((fpclass_type)local_960 != cpp_dec_float_NaN) &&
                        (local_638._120_4_ != cpp_dec_float_NaN)) &&
                       (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare((cpp_dec_float<200U,_int,_void> *)&perm,
                                         (cpp_dec_float<200U,_int,_void> *)local_638), iVar19 < 0))
                    {
                      ppiVar37 = &perm;
                      puVar39 = (undefined4 *)local_638;
                      for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                        *puVar39 = *(undefined4 *)ppiVar37;
                        ppiVar37 = (int **)((long)ppiVar37 + (ulong)bVar52 * -8 + 4);
                        puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                      }
                      local_638._112_4_ = iStack_968;
                      local_638[0x74] = bStack_964;
                      local_638._120_8_ = local_960;
                      local_c00 = CONCAT44(local_c00._4_4_,iVar49);
                    }
                    local_7c8[iVar49] = true;
                  }
                  uVar24 = local_c08;
                  lVar50 = lVar50 + 1;
                  lVar31 = (long)&local_c78->_vptr_DSVectorBase +
                           (long)(this->m_dupRows).data.
                                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar26 = lVar26 + 0x84;
                } while (lVar50 < *(int *)(lVar31 + 0x14));
                iVar49 = (int)local_9e0;
                if ((int)local_bd8 == -1) {
                  bVar51 = true;
                }
                else {
                  lVar31 = (long)(int)local_bd8;
                  pnVar29 = (((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)&local_c48->_vptr_DSVectorBase)->
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  if ((local_6b8.fpclass == cpp_dec_float_NaN) ||
                     (pcVar28 = &local_6b8, pnVar29[lVar31].m_backend.fpclass == cpp_dec_float_NaN))
                  {
LAB_0055c749:
                    pcVar28 = &pnVar29[lVar31].m_backend;
                  }
                  else {
                    iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(pcVar28,&pnVar29[lVar31].m_backend);
                    if (iVar19 < 1) {
                      pnVar29 = (((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   *)&local_c48->_vptr_DSVectorBase)->
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      goto LAB_0055c749;
                    }
                  }
                  pDVar48 = local_c78;
                  pcVar35 = pcVar28;
                  puVar40 = (uint *)local_738;
                  for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                    *puVar40 = (pcVar35->data)._M_elems[0];
                    pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar35 + (ulong)bVar52 * -8 + 4);
                    puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                  }
                  local_738._112_4_ = pcVar28->exp;
                  local_738[0x74] = pcVar28->neg;
                  local_738._120_4_ = pcVar28->fpclass;
                  local_738._124_4_ = pcVar28->prec_elem;
                  pnVar29 = (local_c28->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((local_638._120_4_ == cpp_dec_float_NaN) ||
                     (pnVar29[lVar31].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_0055c7d5:
                    pnVar29 = pnVar29 + lVar31;
                  }
                  else {
                    iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare((cpp_dec_float<200U,_int,_void> *)local_638,
                                     &pnVar29[lVar31].m_backend);
                    pnVar29 = (pointer)local_638;
                    iVar49 = (int)local_9e0;
                    uVar24 = local_c08;
                    if (-1 < iVar19) {
                      pnVar29 = (local_c28->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      goto LAB_0055c7d5;
                    }
                  }
                  pnVar36 = pnVar29;
                  puVar39 = (undefined4 *)local_7b8;
                  for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                    *puVar39 = (pnVar36->m_backend).data._M_elems[0];
                    pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar52 * -2 + 1) * 4);
                    puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                  }
                  local_7b8._112_4_ = (pnVar29->m_backend).exp;
                  local_7b8[0x74] = (pnVar29->m_backend).neg;
                  local_7b8._120_8_ = *(undefined8 *)&(pnVar29->m_backend).fpclass;
                  if (local_c30 == local_b90) {
                    local_bc0.data = (int *)0x0;
                    local_bc0.memFactor = 1.2;
                    local_bc0.themax = iVar30;
                    local_bc0.thesize = iVar18;
                    spx_alloc<int*>(&local_bc0.data,iVar30);
                    if (0 < iVar49) {
                      uVar41 = 0;
                      do {
                        local_bc0.data[uVar41] = perm_tmp[uVar41];
                        uVar41 = uVar41 + 1;
                      } while (uVar24 != uVar41);
                    }
                    local_c10 = (DuplicateRowsPS *)operator_new(0x148);
                    pDVar48 = (this->m_dupRows).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)local_b90;
                    Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::Array(&local_938,&scale);
                    DataArray<int>::DataArray(&local_7e8,&local_bc0);
                    local_ac0.thesize = local_ba8;
                    local_ac0.themax = local_ba4;
                    local_ac0.data = (bool *)0x0;
                    local_ac0.memFactor = local_b98;
                    spx_alloc<bool*>(&local_ac0.data,local_ba4);
                    if ((ulong)(uint)local_ac0.thesize != 0) {
                      memcpy(local_ac0.data,local_ba0,(ulong)(uint)local_ac0.thesize);
                    }
                    uVar12 = local_738._120_8_;
                    bVar11 = (bool)local_738[0x74];
                    uVar10 = local_738._112_4_;
                    uVar9 = local_7b8._120_8_;
                    bVar51 = (bool)local_7b8[0x74];
                    uVar8 = local_7b8._112_4_;
                    puVar39 = (undefined4 *)local_738;
                    puVar46 = local_180;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      *puVar46 = *puVar39;
                      puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                      puVar46 = puVar46 + (ulong)bVar52 * -2 + 1;
                    }
                    puVar40 = (uint *)local_7b8;
                    puVar43 = local_1f0;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      *puVar43 = *puVar40;
                      puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                      puVar43 = puVar43 + (ulong)bVar52 * -2 + 1;
                    }
                    pTVar3 = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_c78 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)(this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                    if (local_c78 !=
                        (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(int *)&(local_c78->
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).m_elem =
                             *(int *)&(local_c78->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).m_elem + 1;
                        UNLOCK();
                      }
                      else {
                        *(int *)&(local_c78->
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).m_elem =
                             *(int *)&(local_c78->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).m_elem + 1;
                      }
                    }
                    RVar53 = Tolerances::epsilon(pTVar3);
                    puVar39 = local_180;
                    psVar44 = (soplex *)&factor;
                    for (lVar50 = 0x1c; uVar13 = local_738._120_8_, lVar50 != 0;
                        lVar50 = lVar50 + -1) {
                      *(undefined4 *)psVar44 = *puVar39;
                      puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                      psVar44 = psVar44 + (ulong)bVar52 * -8 + 4;
                    }
                    factor.m_backend.exp = uVar10;
                    factor.m_backend.neg = bVar11;
                    local_738._120_4_ = (undefined4)uVar12;
                    local_738._124_4_ = SUB84(uVar12,4);
                    factor.m_backend.fpclass = local_738._120_4_;
                    factor.m_backend.prec_elem = local_738._124_4_;
                    puVar40 = local_1f0;
                    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_a88;
                    local_738._120_8_ = uVar13;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      (pnVar38->m_backend).data._M_elems[0] = *puVar40;
                      puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                    }
                    local_a88._112_4_ = uVar8;
                    local_a88[0x74] = bVar51;
                    local_a10 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)uVar9;
                    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&perm,(soplex *)&factor,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_a88,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x0);
                    ppiVar37 = &perm;
                    pnVar38 = &result_2;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      (pnVar38->m_backend).data._M_elems[0] = *(uint *)ppiVar37;
                      ppiVar37 = (int **)((long)ppiVar37 + (ulong)bVar52 * -8 + 4);
                      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                    }
                    result_2.m_backend.exp = iStack_968;
                    result_2.m_backend.neg = bStack_964;
                    result_2.m_backend._120_8_ = local_960;
                    if ((bStack_964 == true) &&
                       (result_2.m_backend.data._M_elems[0] != 0 || (int)local_960 != 0)) {
                      result_2.m_backend.neg = false;
                    }
                    if (NAN(RVar53) || (int)local_960 == 2) {
                      bVar51 = false;
                    }
                    else {
                      local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0x1c00000000;
                      _old_verbosity = ZEXT816(0);
                      local_ce8 = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98[0] = 0;
                      local_c98[1] = 0;
                      stack0xfffffffffffff370 = 0;
                      uStack_c8b = 0;
                      iStack_c88 = 0;
                      bStack_c84 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)&old_verbosity,RVar53);
                      iVar49 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&result_2.m_backend,
                                       (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                      bVar51 = iVar49 < 1;
                    }
                    pDVar7 = local_c10;
                    local_910.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_910.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_910.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_910.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_910.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_910.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_910.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    DuplicateRowsPS::DuplicateRowsPS
                              (local_c10,lp,(int)local_bd8,(int)local_bf8,(int)local_c00,pDVar48,
                               &local_938,&local_7e8,&local_ac0,true,bVar51,&local_910,
                               (int)local_b90 == (int)local_ae0);
                    ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = &pDVar7->super_PostStep;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                              (&ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,pDVar7);
                    if (local_910.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_910.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (local_c78 !=
                        (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c78);
                    }
                    if (local_ac0.data != (bool *)0x0) {
                      free(local_ac0.data);
                      local_ac0.data = (bool *)0x0;
                    }
                    if (local_7e8.data != (int *)0x0) {
                      free(local_7e8.data);
                      local_7e8.data = (int *)0x0;
                    }
                    if (local_938.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_938.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_938.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_938.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                    ::push_back(&local_9e8->data,&ptr);
                    if (ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  else {
                    local_bc0.data = (int *)0x0;
                    local_bc0.memFactor = 1.2;
                    local_bc0.thesize = 0;
                    local_bc0.themax = 1;
                    spx_alloc<int*>(&local_bc0.data,1);
                    local_c10 = (DuplicateRowsPS *)operator_new(0x148);
                    pDVar21 = (this->m_dupRows).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::Array(&local_950,&scale);
                    DataArray<int>::DataArray(&local_800,&local_bc0);
                    local_ad8.thesize = local_ba8;
                    local_ad8.themax = local_ba4;
                    local_ad8.data = (bool *)0x0;
                    local_ad8.memFactor = local_b98;
                    spx_alloc<bool*>(&local_ad8.data,local_ba4);
                    local_c78 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)((long)&pDVar48->_vptr_DSVectorBase + (long)pDVar21);
                    if ((ulong)(uint)local_ad8.thesize != 0) {
                      memcpy(local_ad8.data,local_ba0,(ulong)(uint)local_ad8.thesize);
                    }
                    uVar12 = local_738._120_8_;
                    bVar11 = (bool)local_738[0x74];
                    uVar10 = local_738._112_4_;
                    uVar9 = local_7b8._120_8_;
                    bVar51 = (bool)local_7b8[0x74];
                    uVar8 = local_7b8._112_4_;
                    puVar39 = (undefined4 *)local_738;
                    puVar46 = local_260;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      *puVar46 = *puVar39;
                      puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                      puVar46 = puVar46 + (ulong)bVar52 * -2 + 1;
                    }
                    puVar40 = (uint *)local_7b8;
                    puVar43 = local_2d0;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      *puVar43 = *puVar40;
                      puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                      puVar43 = puVar43 + (ulong)bVar52 * -2 + 1;
                    }
                    pTVar3 = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    p_Var4 = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                      }
                    }
                    RVar53 = Tolerances::epsilon(pTVar3);
                    puVar39 = local_260;
                    psVar44 = (soplex *)&factor;
                    for (lVar50 = 0x1c; uVar13 = local_738._120_8_, lVar50 != 0;
                        lVar50 = lVar50 + -1) {
                      *(undefined4 *)psVar44 = *puVar39;
                      puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                      psVar44 = psVar44 + (ulong)bVar52 * -8 + 4;
                    }
                    factor.m_backend.exp = uVar10;
                    factor.m_backend.neg = bVar11;
                    local_738._120_4_ = (undefined4)uVar12;
                    local_738._124_4_ = SUB84(uVar12,4);
                    factor.m_backend.fpclass = local_738._120_4_;
                    factor.m_backend.prec_elem = local_738._124_4_;
                    puVar40 = local_2d0;
                    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_a88;
                    local_738._120_8_ = uVar13;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      (pnVar38->m_backend).data._M_elems[0] = *puVar40;
                      puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                    }
                    local_a88._112_4_ = uVar8;
                    local_a88[0x74] = bVar51;
                    local_a10 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)uVar9;
                    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&perm,(soplex *)&factor,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_a88,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x0);
                    ppiVar37 = &perm;
                    pnVar38 = &result_2;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      (pnVar38->m_backend).data._M_elems[0] = *(uint *)ppiVar37;
                      ppiVar37 = (int **)((long)ppiVar37 + (ulong)bVar52 * -8 + 4);
                      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                    }
                    result_2.m_backend.exp = iStack_968;
                    result_2.m_backend.neg = bStack_964;
                    result_2.m_backend._120_8_ = local_960;
                    if ((bStack_964 == true) &&
                       (result_2.m_backend.data._M_elems[0] != 0 || (int)local_960 != 0)) {
                      result_2.m_backend.neg = false;
                    }
                    if (NAN(RVar53) || (int)local_960 == 2) {
                      bVar51 = false;
                    }
                    else {
                      local_c80 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0x1c00000000;
                      _old_verbosity = ZEXT816(0);
                      local_ce8 = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98[0] = 0;
                      local_c98[1] = 0;
                      stack0xfffffffffffff370 = 0;
                      uStack_c8b = 0;
                      iStack_c88 = 0;
                      bStack_c84 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)&old_verbosity,RVar53);
                      iVar49 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&result_2.m_backend,
                                       (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                      bVar51 = iVar49 < 1;
                    }
                    pDVar7 = local_c10;
                    local_920.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_920.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_920.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_920.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_920.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_920.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_920.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    DuplicateRowsPS::DuplicateRowsPS
                              (local_c10,lp,(int)local_bd8,(int)local_bf8,(int)local_c00,local_c78,
                               &local_950,&local_800,&local_ad8,false,bVar51,&local_920,
                               local_c30 == local_ae0);
                    ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = &pDVar7->super_PostStep;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                              (&ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,pDVar7);
                    if (local_920.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_920.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                    }
                    if (local_ad8.data != (bool *)0x0) {
                      free(local_ad8.data);
                      local_ad8.data = (bool *)0x0;
                    }
                    if (local_800.data != (int *)0x0) {
                      free(local_800.data);
                      local_800.data = (int *)0x0;
                    }
                    if (local_950.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_950.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_950.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_950.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                    ::push_back(&local_9e8->data,&ptr);
                    if (ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  if (local_bc0.data != (int *)0x0) {
                    free(local_bc0.data);
                  }
                  if (((local_6b8.fpclass == cpp_dec_float_NaN) ||
                      (pnVar29 = (((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)&local_c48->_vptr_DSVectorBase)->
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start,
                      pnVar29[lVar31].m_backend.fpclass == cpp_dec_float_NaN)) ||
                     (iVar49 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_6b8,&pnVar29[lVar31].m_backend), iVar49 < 1)) {
                    bVar51 = true;
                    if (((local_638._120_4_ == cpp_dec_float_NaN) ||
                        (pnVar29 = (local_c28->val).
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                        pnVar29[lVar31].m_backend.fpclass == cpp_dec_float_NaN)) ||
                       (iVar49 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare((cpp_dec_float<200U,_int,_void> *)local_638,
                                         &pnVar29[lVar31].m_backend), -1 < iVar49))
                    goto LAB_0055d4c6;
                  }
                  bVar51 = (bool)local_738[0x74];
                  uVar10 = local_738._112_4_;
                  bVar15 = (bool)local_7b8[0x74];
                  uVar8 = local_7b8._112_4_;
                  puVar39 = (undefined4 *)local_7b8;
                  puVar46 = local_340;
                  for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                    *puVar46 = *puVar39;
                    puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                    puVar46 = puVar46 + (ulong)bVar52 * -2 + 1;
                  }
                  local_bd8 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)local_7b8._120_8_;
                  uStack_bd0 = 0;
                  puVar40 = (uint *)local_738;
                  puVar43 = local_3b0;
                  for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                    *puVar43 = *puVar40;
                    puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                    puVar43 = puVar43 + (ulong)bVar52 * -2 + 1;
                  }
                  local_c78 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)local_738._120_8_;
                  uStack_c70 = 0;
                  feastol(&local_4b0,this);
                  puVar39 = local_340;
                  psVar44 = (soplex *)&result_2;
                  for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                    *(undefined4 *)psVar44 = *puVar39;
                    puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                    psVar44 = psVar44 + (ulong)bVar52 * -8 + 4;
                  }
                  result_2.m_backend.exp = uVar8;
                  result_2.m_backend.neg = bVar15;
                  result_2.m_backend._120_8_ = local_bd8;
                  puVar40 = local_3b0;
                  pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&perm;
                  for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                    (pnVar38->m_backend).data._M_elems[0] = *puVar40;
                    puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                  }
                  iStack_968 = uVar10;
                  bStack_964 = bVar51;
                  local_960 = local_c78;
                  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity,(soplex *)&result_2,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&perm,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)0x0);
                  pnVar38 = &local_4b0;
                  pnVar45 = &factor;
                  for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                    (pnVar45->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
                    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar38 + ((ulong)bVar52 * -2 + 1) * 4);
                    pnVar45 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar45 + ((ulong)bVar52 * -2 + 1) * 4);
                  }
                  factor.m_backend.exp = local_4b0.m_backend.exp;
                  factor.m_backend.neg = local_4b0.m_backend.neg;
                  factor.m_backend.fpclass = local_4b0.m_backend.fpclass;
                  factor.m_backend.prec_elem = local_4b0.m_backend.prec_elem;
                  if (factor.m_backend.data._M_elems[0] != 0 ||
                      local_4b0.m_backend.fpclass != cpp_dec_float_finite) {
                    factor.m_backend.neg = (bool)(local_4b0.m_backend.neg ^ 1);
                  }
                  if (((local_4b0.m_backend.fpclass == cpp_dec_float_NaN) ||
                      ((fpclass_type)local_c80 == cpp_dec_float_NaN)) ||
                     (iVar49 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                       &factor.m_backend), 0 < iVar49)) {
                    if (((local_7b8._120_4_ != cpp_dec_float_NaN) &&
                        (local_738._120_4_ != cpp_dec_float_NaN)) &&
                       (iVar49 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare((cpp_dec_float<200U,_int,_void> *)local_7b8,
                                         (cpp_dec_float<200U,_int,_void> *)local_738), iVar49 < 0))
                    {
                      puVar39 = (undefined4 *)local_738;
                      puVar46 = (undefined4 *)local_7b8;
                      for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                        *puVar46 = *puVar39;
                        puVar39 = puVar39 + (ulong)bVar52 * -2 + 1;
                        puVar46 = puVar46 + (ulong)bVar52 * -2 + 1;
                      }
                      local_7b8._112_4_ = local_738._112_4_;
                      local_7b8[0x74] = local_738[0x74];
                      local_7b8._120_8_ = local_738._120_8_;
                    }
                    puVar40 = (uint *)local_738;
                    pnVar29 = newLhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar31;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      (pnVar29->m_backend).data._M_elems[0] = *puVar40;
                      puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                      pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar52 * -2 + 1) * 4);
                    }
                    newLhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.exp =
                         local_738._112_4_;
                    newLhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.neg =
                         (bool)local_738[0x74];
                    newLhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.fpclass =
                         local_738._120_4_;
                    newLhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.prec_elem =
                         local_738._124_4_;
                    puVar40 = (uint *)local_7b8;
                    pnVar29 = newRhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar31;
                    for (lVar50 = 0x1c; lVar50 != 0; lVar50 = lVar50 + -1) {
                      (pnVar29->m_backend).data._M_elems[0] = *puVar40;
                      puVar40 = puVar40 + (ulong)bVar52 * -2 + 1;
                      pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar52 * -2 + 1) * 4);
                    }
                    newRhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.exp =
                         local_7b8._112_4_;
                    newRhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.neg =
                         (bool)local_7b8[0x74];
                    newRhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.fpclass =
                         local_7b8._120_4_;
                    newRhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31].m_backend.prec_elem =
                         local_7b8._124_4_;
                    bVar51 = true;
                    bVar15 = true;
                  }
                  else {
                    free(perm_tmp);
                    perm_tmp = (int *)0x0;
                    bVar15 = true;
                    bVar51 = false;
                  }
                }
              }
LAB_0055d4c6:
              if (local_ba0 != (bool *)0x0) {
                free(local_ba0);
              }
              if (!bVar51) {
                RVar16 = INFEASIBLE;
                goto LAB_0055d817;
              }
            }
            pIVar22 = (Item *)((long)&(local_c30->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem + 1);
            uVar41 = (ulong)(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum;
          } while ((long)pIVar22 < (long)uVar41);
          if (bVar15) {
            (*(lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x38])(lp,&newLhsVec,&newRhsVec);
            uVar41 = (ulong)(uint)(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .set.thenum;
          }
        }
        perm = (int *)0x0;
        iVar30 = (int)uVar41;
        spx_alloc<int*>(&perm,iVar30);
        if (iVar30 < 1) {
          iVar18 = 0;
          iVar49 = 0;
        }
        else {
          pIVar22 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem;
          pDVar5 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey;
          uVar24 = 0;
          iVar49 = 0;
          iVar18 = 0;
          do {
            if (local_7c8[uVar24] == true) {
              perm[uVar24] = -1;
              iVar18 = iVar18 + 1;
              iVar49 = iVar49 + pIVar22[pDVar5[uVar24].idx].data.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused;
            }
            else {
              perm[uVar24] = 0;
            }
            uVar24 = uVar24 + 1;
          } while ((uVar41 & 0xffffffff) != uVar24);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x11])(lp,perm);
        if (0 < iVar30) {
          piVar32 = (this->m_rIdx).data;
          uVar24 = 0;
          do {
            if (-1 < (long)perm[uVar24]) {
              piVar32[perm[uVar24]] = piVar32[uVar24];
            }
            uVar24 = uVar24 + 1;
          } while ((uVar41 & 0xffffffff) != uVar24);
        }
        free(perm);
        RVar16 = OKAY;
        perm = (int *)0x0;
        free(perm_tmp);
        perm_tmp = (int *)0x0;
        if (iVar49 + iVar18 != 0 && SCARRY4(iVar49,iVar18) == iVar49 + iVar18 < 0) {
          piVar32 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remRows;
          *piVar32 = *piVar32 + iVar18;
          piVar32 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar32 = *piVar32 + iVar49;
          pSVar23 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar23 != (SPxOut *)0x0) && (3 < (int)pSVar23->m_verbosity)) {
            old_verbosity = pSVar23->m_verbosity;
            result_2.m_backend.data._M_elems[0] = 4;
            (*pSVar23->_vptr_SPxOut[2])();
            pSVar23 = soplex::operator<<((this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).spxout,"Simplifier (duplicate rows) removed ");
            std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar18);
            pSVar23 = soplex::operator<<(pSVar23," rows, ");
            std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar49);
            pSVar23 = soplex::operator<<(pSVar23," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar23->m_streams[pSVar23->m_verbosity]);
            pSVar23 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar23->_vptr_SPxOut[2])(pSVar23,&old_verbosity);
          }
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 0x1c;
          result_2.m_backend.data._M_elems[0] = 0;
          result_2.m_backend.data._M_elems[1] = 0;
          result_2.m_backend.data._M_elems[2] = 0;
          result_2.m_backend.data._M_elems[3] = 0;
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems[6] = 0;
          result_2.m_backend.data._M_elems[7] = 0;
          result_2.m_backend.data._M_elems[8] = 0;
          result_2.m_backend.data._M_elems[9] = 0;
          result_2.m_backend.data._M_elems[10] = 0;
          result_2.m_backend.data._M_elems[0xb] = 0;
          result_2.m_backend.data._M_elems[0xc] = 0;
          result_2.m_backend.data._M_elems[0xd] = 0;
          result_2.m_backend.data._M_elems[0xe] = 0;
          result_2.m_backend.data._M_elems[0xf] = 0;
          result_2.m_backend.data._M_elems[0x10] = 0;
          result_2.m_backend.data._M_elems[0x11] = 0;
          result_2.m_backend.data._M_elems[0x12] = 0;
          result_2.m_backend.data._M_elems[0x13] = 0;
          result_2.m_backend.data._M_elems[0x14] = 0;
          result_2.m_backend.data._M_elems[0x15] = 0;
          result_2.m_backend.data._M_elems[0x16] = 0;
          result_2.m_backend.data._M_elems[0x17] = 0;
          result_2.m_backend.data._M_elems[0x18] = 0;
          result_2.m_backend.data._M_elems[0x19] = 0;
          result_2.m_backend.data._M_elems._104_5_ = 0;
          result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,(long)iVar20,(type *)0x0);
          pnVar38 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_minReduction;
          if (&result_2 != pnVar38) {
            pnVar45 = &result_2;
            for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
              (pnVar45->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
              pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar38 + (ulong)bVar52 * -8 + 4);
              pnVar45 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar45 + ((ulong)bVar52 * -2 + 1) * 4);
            }
            result_2.m_backend.exp =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.exp;
            result_2.m_backend.neg =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.neg;
            result_2.m_backend.fpclass =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.fpclass;
            result_2.m_backend.prec_elem =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&old_verbosity);
          if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>
                      ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,(long)iVar18,(type *)0x0);
            iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&old_verbosity
                               );
            if (iVar20 < 0) {
              *again = true;
              RVar16 = OKAY;
            }
          }
        }
LAB_0055d817:
        if (newRhsVec.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(newRhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)newRhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)newRhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (newLhsVec.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(newLhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)newLhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)newLhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_7c8 != (bool *)0x0) {
          free(local_7c8);
        }
        if (scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_8c8 != (int *)0x0) {
          free(local_8c8);
        }
        if (local_9f8 != (int *)0x0) {
          free(local_9f8);
        }
      }
    }
  }
  return RVar16;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}